

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

size_t ma_dr_wav_read_raw(ma_dr_wav *pWav,size_t bytesToRead,void *pBufferOut)

{
  ma_bool32 mVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  size_t bytesToSeek;
  ma_uint8 buffer [4096];
  undefined1 local_1038 [4104];
  
  if (bytesToRead != 0 && pWav != (ma_dr_wav *)0x0) {
    uVar5 = pWav->bytesRemaining;
    if (uVar5 < bytesToRead) {
      bytesToRead = uVar5;
    }
    if (uVar5 != 0) {
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar4 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar4 = (uint)(pWav->fmt).blockAlign;
      }
      if ((pWav->translatedFormatTag & 0xfffe) == 6) {
        if (uVar4 == 0) {
          return 0;
        }
        if (uVar4 != (pWav->fmt).channels) {
          return 0;
        }
      }
      else if (uVar4 == 0) {
        return 0;
      }
      if (pBufferOut == (void *)0x0) {
        uVar5 = 0;
        do {
          sVar2 = uVar5;
          uVar5 = bytesToRead - sVar2;
          if (bytesToRead < sVar2 || uVar5 == 0) break;
          if (0x7ffffffe < uVar5) {
            uVar5 = 0x7fffffff;
          }
          mVar1 = (*pWav->onSeek)(pWav->pUserData,(int)uVar5,ma_dr_wav_seek_origin_current);
          uVar5 = uVar5 + sVar2;
        } while (mVar1 != 0);
        do {
          uVar5 = bytesToRead - sVar2;
          if (bytesToRead < sVar2 || uVar5 == 0) break;
          if (0xfff < uVar5) {
            uVar5 = 0x1000;
          }
          sVar3 = (*pWav->onRead)(pWav->pUserData,local_1038,uVar5);
          sVar2 = sVar2 + sVar3;
        } while (uVar5 <= sVar3);
      }
      else {
        sVar2 = (*pWav->onRead)(pWav->pUserData,pBufferOut,bytesToRead);
      }
      pWav->readCursorInPCMFrames = pWav->readCursorInPCMFrames + sVar2 / uVar4;
      pWav->bytesRemaining = pWav->bytesRemaining - sVar2;
      return sVar2;
    }
  }
  return 0;
}

Assistant:

MA_API size_t ma_dr_wav_read_raw(ma_dr_wav* pWav, size_t bytesToRead, void* pBufferOut)
{
    size_t bytesRead;
    ma_uint32 bytesPerFrame;
    if (pWav == NULL || bytesToRead == 0) {
        return 0;
    }
    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    if (pBufferOut != NULL) {
        bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);
    } else {
        bytesRead = 0;
        while (bytesRead < bytesToRead) {
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > 0x7FFFFFFF) {
                bytesToSeek = 0x7FFFFFFF;
            }
            if (pWav->onSeek(pWav->pUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current) == MA_FALSE) {
                break;
            }
            bytesRead += bytesToSeek;
        }
        while (bytesRead < bytesToRead) {
            ma_uint8 buffer[4096];
            size_t bytesSeeked;
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > sizeof(buffer)) {
                bytesToSeek = sizeof(buffer);
            }
            bytesSeeked = pWav->onRead(pWav->pUserData, buffer, bytesToSeek);
            bytesRead += bytesSeeked;
            if (bytesSeeked < bytesToSeek) {
                break;
            }
        }
    }
    pWav->readCursorInPCMFrames += bytesRead / bytesPerFrame;
    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}